

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

int __thiscall
CSnapshotDelta::UnpackDelta
          (CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pSrcData,int DataSize)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  void *dest;
  undefined1 *puVar5;
  uchar *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  uint uVar12;
  int *piVar13;
  long lVar14;
  uint size;
  uint *source;
  uint *puVar15;
  uint Key;
  long in_FS_OFFSET;
  CSnapshotBuilder Builder;
  
  puVar5 = &stack0xffffffffffffffd0;
  do {
    puVar11 = puVar5;
    *(undefined8 *)(puVar11 + -0x1000) = 0;
    puVar5 = puVar11 + -0x1000;
  } while (puVar11 + -0x1000 != Builder.m_aData + 0x10);
  *(CSnapshot **)(puVar11 + -0x1068) = pFrom;
  *(undefined8 *)(puVar11 + 0xfff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(puVar11 + 0xeff0) = 0;
  *(undefined4 *)(puVar11 + 0xfff4) = 0;
  if (-1 < (long)*pSrcData) {
    puVar15 = (uint *)((long)pSrcData + (long)*pSrcData * 4 + 0xc);
    if (puVar15 <= (uint *)((long)DataSize + (long)pSrcData)) {
      *(uint **)(puVar11 + -0x1028) = (uint *)((long)DataSize + (long)pSrcData);
      *(CSnapshotDelta **)(puVar11 + -0x1060) = this;
      *(CSnapshot **)(puVar11 + -0x1048) = pTo;
      iVar4 = *(int *)(*(long *)(puVar11 + -0x1068) + 4);
      if (0 < iVar4) {
        *(long *)(puVar11 + -0x1058) = *(long *)(puVar11 + -0x1068) + 8;
        uVar9 = 0;
        do {
          lVar7 = (long)iVar4;
          lVar8 = *(long *)(puVar11 + -0x1058) + lVar7 * 4 + lVar7 * 4;
          piVar13 = (int *)(*(long *)(puVar11 + -0x1058) + lVar7 * 4 + uVar9 * 4);
          iVar1 = *piVar13;
          piVar13 = piVar13 + 1;
          if (uVar9 == iVar4 - 1) {
            piVar13 = *(int **)(puVar11 + -0x1068);
          }
          uVar2 = *(uint *)(iVar1 + lVar8);
          if (0 < (long)*pSrcData) {
            lVar14 = 0;
            do {
              if (*(uint *)((long)pSrcData + lVar14 * 4 + 0xc) == uVar2) goto LAB_001ca848;
              lVar14 = lVar14 + 1;
            } while (*pSrcData != lVar14);
          }
          uVar12 = (*piVar13 - iVar1) - 4;
          *(undefined8 *)(puVar11 + -0x1070) = 0x1ca82d;
          dest = CSnapshotBuilder::NewItem
                           ((CSnapshotBuilder *)(puVar11 + -0x1010),(int)uVar2 >> 0x10,
                            uVar2 & 0xffff,uVar12);
          *(undefined8 *)(puVar11 + -0x1070) = 0x1ca83e;
          mem_copy(dest,(void *)(lVar8 + iVar1 + 4),uVar12);
          iVar4 = *(int *)(*(long *)(puVar11 + -0x1068) + 4);
          lVar7 = (long)iVar4;
LAB_001ca848:
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < lVar7);
      }
      lVar8 = *(long *)(puVar11 + -0x1060);
      if (0 < *(int *)((long)pSrcData + 4)) {
        *(long *)(puVar11 + -0x1038) = *(long *)(puVar11 + -0x1068) + 8;
        *(long *)(puVar11 + -0x1040) = *(long *)(puVar11 + -0x1068) + 0xc;
        uVar9 = 0;
        *(void **)(puVar11 + -0x1030) = pSrcData;
        do {
          source = puVar15 + 2;
          puVar3 = *(uint **)(puVar11 + -0x1028);
          if (puVar3 < source) goto LAB_001ca76f;
          uVar2 = *puVar15;
          uVar10 = (ulong)uVar2;
          iVar4 = -3;
          if ((0x7fff < uVar10) || (uVar12 = puVar15[1], 0xffff < uVar12)) goto LAB_001ca774;
          if ((0x3f < uVar2) || (size = (uint)*(short *)(lVar8 + uVar10 * 2), size == 0)) {
            if (puVar3 < puVar15 + 3) {
              iVar4 = -2;
              goto LAB_001ca774;
            }
            if (0x1fffffff < *source) goto LAB_001ca774;
            size = *source << 2;
            source = puVar15 + 3;
          }
          if (((int)size < 0) || (puVar3 < (uint *)((long)(int)size + (long)source)))
          goto LAB_001ca774;
          *(ulong *)(puVar11 + -0x1020) = uVar9;
          Key = uVar2 << 0x10 | uVar12;
          if (0 < (long)*(int *)(puVar11 + 0xfff4)) {
            lVar8 = 0;
            do {
              if (*(uint *)(puVar11 + (long)*(int *)(puVar11 + lVar8 * 4 + 0xeff4) + -0x1010) == Key
                 ) {
                puVar5 = puVar11 + (long)*(int *)(puVar11 + lVar8 * 4 + 0xeff4) + -0x100c;
                goto LAB_001ca959;
              }
              lVar8 = lVar8 + 1;
            } while (*(int *)(puVar11 + 0xfff4) != lVar8);
          }
          *(undefined8 *)(puVar11 + -0x1070) = 0x1ca94c;
          puVar5 = (undefined1 *)
                   CSnapshotBuilder::NewItem
                             ((CSnapshotBuilder *)(puVar11 + -0x1010),uVar2,uVar12,size);
LAB_001ca959:
          *(undefined8 *)(puVar11 + -0x1070) = 0x1ca965;
          iVar4 = CSnapshot::GetItemIndex(*(CSnapshot **)(puVar11 + -0x1068),Key);
          *(ulong *)(puVar11 + -0x1050) = (ulong)size;
          if (iVar4 == -1) {
            *(undefined8 *)(puVar11 + -0x1070) = 0x1caa1c;
            mem_copy(puVar5,source,size);
            lVar8 = *(long *)(puVar11 + -0x1060);
            piVar13 = (int *)(lVar8 + 0x80 + uVar10 * 4);
            *piVar13 = *piVar13 + size * 8;
          }
          else {
            lVar8 = *(long *)(puVar11 + -0x1060);
            if (3 < size) {
              *(long *)(puVar11 + -0x1058) =
                   (long)*(int *)(*(long *)(puVar11 + -0x1038) +
                                  (long)*(int *)(*(long *)(puVar11 + -0x1068) + 4) * 4 +
                                 (long)iVar4 * 4) +
                   (long)*(int *)(*(long *)(puVar11 + -0x1068) + 4) * 8 +
                   *(long *)(puVar11 + -0x1040);
              uVar9 = *(ulong *)(puVar11 + -0x1050);
              lVar7 = 0;
              do {
                *(uint *)(puVar5 + lVar7 * 4) =
                     source[lVar7] + *(int *)(*(long *)(puVar11 + -0x1058) + lVar7 * 4);
                uVar2 = source[lVar7];
                if (uVar2 == 0) {
                  iVar4 = *(int *)(lVar8 + 0x80 + uVar10 * 4) + 1;
                }
                else {
                  *(undefined8 *)(puVar11 + -0x1070) = 0x1ca9dd;
                  puVar6 = CVariableInt::Pack(puVar11 + -0x1015,uVar2);
                  lVar8 = *(long *)(puVar11 + -0x1060);
                  iVar4 = ((int)puVar6 - (int)(puVar11 + -0x1015)) * 8 +
                          *(int *)(lVar8 + 0x80 + uVar10 * 4);
                }
                *(int *)(lVar8 + 0x80 + uVar10 * 4) = iVar4;
                lVar7 = lVar7 + 1;
              } while (((uint)(uVar9 >> 2) & 0x3fffffff) != (uint)lVar7);
            }
          }
          piVar13 = (int *)(lVar8 + 0x20080 + uVar10 * 4);
          *piVar13 = *piVar13 + 1;
          puVar15 = (uint *)((long)source +
                            (ulong)((uint)*(undefined8 *)(puVar11 + -0x1050) & 0xfffffffc));
          uVar9 = (ulong)((int)*(undefined8 *)(puVar11 + -0x1020) + 1U);
        } while ((int)((int)*(undefined8 *)(puVar11 + -0x1020) + 1U) <
                 *(int *)(*(long *)(puVar11 + -0x1030) + 4));
      }
      *(undefined8 *)(puVar11 + -0x1070) = 0x1caa68;
      iVar4 = CSnapshotBuilder::Finish
                        ((CSnapshotBuilder *)(puVar11 + -0x1010),*(void **)(puVar11 + -0x1048));
      goto LAB_001ca774;
    }
  }
LAB_001ca76f:
  iVar4 = -1;
LAB_001ca774:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar11 + 0xfff8)) {
    *(code **)(puVar11 + -0x1070) = CSnapshotBuilder::Init;
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int CSnapshotDelta::UnpackDelta(const CSnapshot *pFrom, CSnapshot *pTo, const void *pSrcData, int DataSize)
{
	CSnapshotBuilder Builder;
	const CData *pDelta = (const CData *)pSrcData;
	const int *pData = (const int *)pDelta->m_pData;
	const int *pEnd = (const int *)(((const char *)pSrcData + DataSize));

	const CSnapshotItem *pFromItem;
	int Keep, ItemSize;
	const int *pDeleted;
	int ID, Type, Key;
	int FromIndex;
	int *pNewData;

	Builder.Init();

	// unpack deleted stuff
	pDeleted = pData;
	if(pDelta->m_NumDeletedItems < 0)
		return -1;
	pData += pDelta->m_NumDeletedItems;
	if(pData > pEnd)
		return -1;

	// copy all non deleted stuff
	for(int i = 0; i < pFrom->NumItems(); i++)
	{
		// dbg_assert(0, "fail!");
		pFromItem = pFrom->GetItem(i);
		ItemSize = pFrom->GetItemSize(i);
		Keep = 1;
		for(int d = 0; d < pDelta->m_NumDeletedItems; d++)
		{
			if(pDeleted[d] == pFromItem->Key())
			{
				Keep = 0;
				break;
			}
		}

		if(Keep)
		{
			// keep it
			mem_copy(
				Builder.NewItem(pFromItem->Type(), pFromItem->ID(), ItemSize),
				pFromItem->Data(), ItemSize);
		}
	}

	// unpack updated stuff
	for(int i = 0; i < pDelta->m_NumUpdateItems; i++)
	{
		if(pData+2 > pEnd)
			return -1;

		Type = *pData++;
		if(Type < 0 || Type > CSnapshot::MAX_TYPE)
			return -3;

		ID = *pData++;
		if(ID < 0 || ID > CSnapshot::MAX_ID)
			return -3;

		if(Type < MAX_NETOBJSIZES && m_aItemSizes[Type])
			ItemSize = m_aItemSizes[Type];
		else
		{
			if(pData+1 > pEnd)
				return -2;
			if(*pData < 0 || *pData > INT_MAX / 4)
				return -3;
			ItemSize = (*pData++) * 4;
		}

		if(RangeCheck(pEnd, pData, ItemSize) || ItemSize < 0) return -3;

		Key = (Type<<16)|(ID&0xffff);

		// create the item if needed
		pNewData = Builder.GetItemData(Key);
		if(!pNewData)
			pNewData = (int *)Builder.NewItem(Key>>16, Key&0xffff, ItemSize);

		//if(range_check(pEnd, pNewData, ItemSize)) return -4;

		FromIndex = pFrom->GetItemIndex(Key);
		if(FromIndex != -1)
		{
			// we got an update so we need to apply the diff
			UndiffItem(pFrom->GetItem(FromIndex)->Data(), pData, pNewData, ItemSize / 4, &m_aSnapshotDataRate[Type]);
			m_aSnapshotDataUpdates[Type]++;
		}
		else // no previous, just copy the pData
		{
			mem_copy(pNewData, pData, ItemSize);
			m_aSnapshotDataRate[Type] += ItemSize * 8;
			m_aSnapshotDataUpdates[Type]++;
		}

		pData += ItemSize/4;
	}

	// finish up
	return Builder.Finish(pTo);
}